

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O2

void helper_mttc0_vpeconf0_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  env->CP0_VPEConf0 = (uint)arg1 & 3 | env->CP0_VPEConf0 & 0xfffffffcU;
  return;
}

Assistant:

static CPUMIPSState *mips_cpu_map_tc(CPUMIPSState *env, int *tc)
{
    CPUState *cs;
    // int vpe_idx;
    int tc_idx = *tc;

    if (!(env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP))) {
        /* Not allowed to address other CPUs.  */
        *tc = env->current_tc;
        return env;
    }

    cs = env_cpu(env);
    // vpe_idx = tc_idx / cs->nr_threads;
    *tc = tc_idx % cs->nr_threads;
    return env;

#if 0
    MIPSCPU *cpu;
    CPUState *other_cs;
    other_cs = qemu_get_cpu(vpe_idx);
    if (other_cs == NULL) {
        return env;
    }
    cpu = MIPS_CPU(other_cs);
    return &cpu->env;
#endif
}